

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  ostream *poVar1;
  long in_RSI;
  int in_EDI;
  ofstream outfile;
  TraverseMinimizer sb;
  NodeList adjList;
  ifstream input;
  bool verbose;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_fffffffffffffb90;
  NodeList *in_stack_fffffffffffffb98;
  basic_ostream<char,_std::char_traits<char>_> *in_stack_fffffffffffffba0;
  NodeList *in_stack_fffffffffffffba8;
  TraverseMinimizer *in_stack_fffffffffffffbb0;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_fffffffffffffbc8;
  vector<Node_*,_std::allocator<Node_*>_> *in_stack_fffffffffffffbd0;
  InputParser local_240 [4];
  ifstream local_220 [352];
  InputParser *in_stack_ffffffffffffff40;
  int local_4;
  
  local_4 = 0;
  if (in_EDI < 3) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "Syntax: ./project3 <input_file> <output_file> [verbose]");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "(add any character to the end to output results to the console)");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
    local_4 = 1;
  }
  else {
    std::ifstream::ifstream(local_220,*(undefined8 *)(in_RSI + 8),8);
    InputParser::InputParser(local_240,local_220);
    InputParser::parse(in_stack_ffffffffffffff40);
    std::vector<Node_*,_std::allocator<Node_*>_>::vector
              (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
    TraverseMinimizer::TraverseMinimizer(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8);
    if (3 < in_EDI) {
      report(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    }
    std::ofstream::ofstream(&stack0xfffffffffffffb90,*(undefined8 *)(in_RSI + 0x10),0x10);
    report(in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
    std::ofstream::~ofstream(&stack0xfffffffffffffb90);
    TraverseMinimizer::~TraverseMinimizer((TraverseMinimizer *)0x1024fe);
    std::vector<Node_*,_std::allocator<Node_*>_>::~vector(in_stack_fffffffffffffb90);
    std::ifstream::~ifstream(local_220);
  }
  return local_4;
}

Assistant:

int main(int argc, char* argv[]) {
    bool verbose = argc > 3;
    if (argc < 3) {
        std::cout << "Syntax: ./project3 <input_file> <output_file> [verbose]" << std::endl;
        std::cout << "(add any character to the end to output results to the console)" << std::endl;
        return 1;
    }

    std::ifstream input(argv[1]);
    NodeList adjList = InputParser(input).parse();
    TraverseMinimizer sb(adjList);

    if (verbose) {
        report(std::cout, sb.startingPoints);
    }

    std::ofstream outfile(argv[2]);
    report(outfile, sb.startingPoints);
}